

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

RefCntAutoPtr<Diligent::RenderDeviceVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator=
          (RefCntAutoPtr<Diligent::RenderDeviceVkImpl> *this,RenderDeviceVkImpl *pObj)

{
  RenderDeviceVkImpl *pRVar1;
  char (*in_RCX) [26];
  string msg;
  string local_38;
  
  pRVar1 = this->m_pObject;
  if (pRVar1 != pObj) {
    if (pRVar1 != (RenderDeviceVkImpl *)0x0) {
      if ((pRVar1->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
          super_ObjectBase<Diligent::IRenderDeviceVk>.
          super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters == (RefCountersImpl *)0x0
         ) {
        FormatString<char[26],char[26]>
                  (&local_38,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
        in_RCX = (char (*) [26])0x229;
        DebugAssertionFailed
                  (local_38._M_dataplus._M_p,"Release",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Common/interface/RefCountedObjectImpl.hpp"
                   ,0x229);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
      RefCountersImpl::ReleaseStrongRef<Diligent::RefCountersImpl::ReleaseStrongRef()::_lambda()_1_>
                ((pRVar1->
                 super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                 ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                 super_ObjectBase<Diligent::IRenderDeviceVk>.
                 super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters,
                 (anon_class_1_0_00000001 *)&local_38);
    }
    this->m_pObject = pObj;
    if (pObj != (RenderDeviceVkImpl *)0x0) {
      if ((pObj->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
          super_ObjectBase<Diligent::IRenderDeviceVk>.
          super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters == (RefCountersImpl *)0x0
         ) {
        FormatString<char[26],char[26]>
                  (&local_38,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
        DebugAssertionFailed
                  (local_38._M_dataplus._M_p,"AddRef",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Common/interface/RefCountedObjectImpl.hpp"
                   ,0x221);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
      RefCountersImpl::AddStrongRef
                ((pObj->
                 super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                 ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                 super_ObjectBase<Diligent::IRenderDeviceVk>.
                 super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }